

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog_util.c
# Opt level: O0

libdeflate_compressor * alloc_compressor(int level)

{
  libdeflate_compressor *plVar1;
  uint in_EDI;
  libdeflate_compressor *c;
  
  plVar1 = libdeflate_alloc_compressor(0);
  if (plVar1 == (libdeflate_compressor *)0x0) {
    msg_errno("Unable to allocate compressor with compression level %d",(ulong)in_EDI);
  }
  return plVar1;
}

Assistant:

struct libdeflate_compressor *
alloc_compressor(int level)
{
	struct libdeflate_compressor *c;

	c = libdeflate_alloc_compressor(level);
	if (c == NULL) {
		msg_errno("Unable to allocate compressor with "
			  "compression level %d", level);
	}
	return c;
}